

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O3

bool BasePort::ParseOptions
               (char *arg,PortType *portType,int *portNum,string *IPaddr,bool *fwBridge,
               ostream *ostr)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  size_t sVar7;
  size_t sVar8;
  char *__s;
  char local_40 [4];
  uint uStack_3c;
  
  if (arg == (char *)0x0) {
LAB_0010c46a:
    std::__ostream_insert<char,std::char_traits<char>>
              (ostr,"ParseOptions: no option provided, using default ",0x30);
    builtin_strncpy(local_40,"fw:0",4);
    uStack_3c = uStack_3c & 0xffffff00;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(ostr,local_40,4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    builtin_strncpy(local_40,"fw:0",4);
    uStack_3c = uStack_3c & 0xffffff00;
    bVar3 = ParseOptions(local_40,portType,portNum,IPaddr,fwBridge,(ostream *)&std::cerr);
    return bVar3;
  }
  bVar1 = *arg;
  if (bVar1 < 0x66) {
    if (bVar1 == 0) goto LAB_0010c46a;
    if (((bVar1 == 0x65) && (arg[1] == 't')) && (arg[2] == 'h')) {
      *portType = PORT_ETH_RAW;
      *fwBridge = false;
      lVar5 = 4;
      if (arg[3] == 'f') {
        cVar2 = arg[4];
        *fwBridge = cVar2 == 'w';
        lVar5 = (ulong)(cVar2 == 'w') * 2 + 4;
      }
      iVar4 = __isoc99_sscanf(arg + lVar5,"%d",portNum);
      return iVar4 == 1;
    }
LAB_0010c605:
    iVar4 = strncmp(arg,"emio",4);
    if (iVar4 != 0) {
      *portType = PORT_FIREWIRE;
      iVar4 = __isoc99_sscanf(arg,"%d",portNum);
      if (iVar4 == 1) {
        return true;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (ostr,"ParseOptions: failed to find a FireWire port number in ",0x37);
      sVar7 = strlen(arg);
LAB_0010c669:
      std::__ostream_insert<char,std::char_traits<char>>(ostr,arg,sVar7);
      std::ios::widen((char)*(undefined8 *)(*(long *)ostr + -0x18) + (char)ostr);
      std::ostream::put((char)ostr);
      std::ostream::flush();
      return false;
    }
    *portType = PORT_ZYNQ_EMIO;
    sVar7 = strlen(arg);
    if (sVar7 == 4) {
LAB_0010c6af:
      *portNum = 0;
      return true;
    }
    if (arg[4] != ':') {
      __s = "ParseOptions: missing \":\" after \"emio\"";
      sVar7 = 0x26;
      goto LAB_0010c719;
    }
    iVar4 = __isoc99_sscanf(arg + 5,"%d",portNum);
    if (iVar4 == 1) {
      return true;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (ostr,"ParseOptions: failed to find a port number after \"emio:\" in ",0x3c);
  }
  else {
    if (bVar1 != 0x66) {
      if (((bVar1 == 0x75) && (arg[1] == 'd')) && (arg[2] == 'p')) {
        *portType = PORT_ETH_UDP;
        *fwBridge = false;
        if (arg[3] == 'f') {
          bVar3 = arg[4] == 'w';
          *fwBridge = bVar3;
          sVar7 = (ulong)bVar3 * 2 + 3;
        }
        else {
          sVar7 = 3;
          bVar3 = false;
        }
        sVar8 = strlen(arg);
        if (sVar8 == sVar7) {
          std::__cxx11::string::_M_replace
                    ((ulong)IPaddr,0,(char *)IPaddr->_M_string_length,0x1191cd);
          return true;
        }
        if (arg[sVar7] == ':') {
          sVar7 = strlen(arg + sVar7 + 1);
          if (7 < sVar7) {
            std::__cxx11::string::assign((char *)IPaddr);
            return true;
          }
          return true;
        }
        if (bVar3) {
          __s = "ParseOptions: missing \":\" after \"udpfw\"";
          sVar7 = 0x27;
        }
        else {
          __s = "ParseOptions: missing \":\" after \"udp\"";
          sVar7 = 0x25;
        }
        goto LAB_0010c719;
      }
      goto LAB_0010c605;
    }
    if (arg[1] != 'w') goto LAB_0010c605;
    *portType = PORT_FIREWIRE;
    sVar7 = strlen(arg);
    if (sVar7 == 2) goto LAB_0010c6af;
    if (arg[2] != ':') {
      arg = "ParseOptions: missing \":\" after \"fw\"";
      sVar7 = 0x24;
      goto LAB_0010c669;
    }
    iVar4 = __isoc99_sscanf(arg + 3,"%d",portNum);
    if (iVar4 == 1) {
      return true;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (ostr,"ParseOptions: failed to find a port number after \"fw:\" in ",0x3a);
  }
  __s = arg + 3;
  sVar7 = strlen(__s);
LAB_0010c719:
  std::__ostream_insert<char,std::char_traits<char>>(ostr,__s,sVar7);
  std::endl<char,std::char_traits<char>>(ostr);
  return false;
}

Assistant:

bool BasePort::ParseOptions(const char *arg, PortType &portType, int &portNum, std::string &IPaddr,
                            bool &fwBridge, std::ostream &ostr)
{
    // no option, using default
    if ((arg == 0) || (strlen(arg) == 0)) {
        ostr << "ParseOptions: no option provided, using default "
             << DefaultPort() << std::endl;
        return ParseOptions(DefaultPort().c_str(), portType, portNum, IPaddr, fwBridge);
    }
    // expecting proper options
    if (strncmp(arg, "fw", 2) == 0) {
        portType = PORT_FIREWIRE;
        // no port specified
        if (strlen(arg) == 2) {
            portNum = 0;
            return true;
        }
        // make sure separator is here
        if (arg[2] != ':') {
            ostr << "ParseOptions: missing \":\" after \"fw\"" << std::endl;
            return false;
        }
        // scan port number
        if (sscanf(arg+3, "%d", &portNum) == 1) {
            return true;
        }
        ostr << "ParseOptions: failed to find a port number after \"fw:\" in " << arg+3 << std::endl;
        return false;
    }
    else if (strncmp(arg, "eth", 3) == 0) {
        portType = PORT_ETH_RAW;
        fwBridge = false;
        unsigned int numOffset = 4;
        if (strncmp(arg+3, "fw", 2) == 0) {
            fwBridge = true;
            numOffset += 2;
        }
        return (sscanf(arg+numOffset, "%d", &portNum) == 1);
    }
    else if (strncmp(arg, "udp", 3) == 0) {
        portType = PORT_ETH_UDP;
        fwBridge = false;
        unsigned int colonPos = 3;
        if (strncmp(arg+3, "fw", 2) == 0) {
            fwBridge = true;
            colonPos += 2;
        }
        // no option specified
        if (strlen(arg) == colonPos) {
            IPaddr = ETH_UDP_DEFAULT_IP;
            return true;
        }
        // make sure separator is here
        if (arg[colonPos] != ':') {
            if (colonPos == 3)
                ostr << "ParseOptions: missing \":\" after \"udp\"" << std::endl;
            else
                ostr << "ParseOptions: missing \":\" after \"udpfw\"" << std::endl;
            return false;
        }
        // For now, if at least 8 characters, assume a valid IP address
        if (strlen(arg+colonPos+1) >= 8)
            IPaddr.assign(arg+colonPos+1);
        return true;
    }
    else if (strncmp(arg, "emio", 4) == 0) {
        portType = PORT_ZYNQ_EMIO;
        // no port specified
        if (strlen(arg) == 4) {
            portNum = 0;
            return true;
        }
        // make sure separator is here
        if (arg[4] != ':') {
            ostr << "ParseOptions: missing \":\" after \"emio\"" << std::endl;
            return false;
        }
        // scan port number
        if (sscanf(arg+5, "%d", &portNum) == 1) {
            return true;
        }
        ostr << "ParseOptions: failed to find a port number after \"emio:\" in " << arg+3 << std::endl;
        return false;
    }
    // older default, fw and looking for port number
    portType = PORT_FIREWIRE;
    // scan port number
    if (sscanf(arg, "%d", &portNum) == 1) {
        return true;
    }
    ostr << "ParseOptions: failed to find a FireWire port number in " << arg << std::endl;
    return false;
}